

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,db_atom<double> *atom)

{
  string local_30;
  
  local_30.field_2._M_allocated_capacity._0_4_ = 0x4c414552;
  local_30._M_string_length = 4;
  local_30.field_2._M_local_buf[4] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ExtractModel::putColumn<hiberlite::AVisitor<hiberlite::ExtractModel>>(this->actor,this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(db_atom<X> atom)
{
	actor->act(*this,atom);
	return *this;
}